

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O2

ssize_t __thiscall ymfm::ymf278b::write(ymf278b *this,int __fd,void *__buf,size_t __n)

{
  ulong in_RAX;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  uint8_t data;
  
  data = (uint8_t)__buf;
  switch(__fd & 7) {
  case 0:
    in_RAX = (ulong)__buf & 0xff;
    break;
  case 1:
  case 3:
    write_data(this,data);
    return extraout_RAX;
  case 2:
    write_address_hi(this,data);
    return extraout_RAX_00;
  case 4:
    in_RAX = (ulong)((uint)__buf & 0xff | 0x200);
    break;
  case 5:
    write_data_pcm(this,data);
    return extraout_RAX_01;
  default:
    goto switchD_001484a0_default;
  }
  this->m_address = (uint16_t)in_RAX;
switchD_001484a0_default:
  return in_RAX;
}

Assistant:

void ymf278b::write(uint32_t offset, uint8_t data)
{
	switch (offset & 7)
	{
		case 0: // address port
			write_address(data);
			break;

		case 1: // data port
			write_data(data);
			break;

		case 2: // address port
			write_address_hi(data);
			break;

		case 3: // data port
			write_data(data);
			break;

		case 4: // PCM address port
			write_address_pcm(data);
			break;

		case 5: // PCM address port
			write_data_pcm(data);
			break;

		default:
			debug::log_unexpected_read_write("Unexpected write to ymf278b offset %d\n", offset & 7);
			break;
	}
}